

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<16>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  float fVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  TriangleRasterizer *pTVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  undefined8 *puVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long *plVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  deInt64 sy [4];
  Vector<long,_4> e20 [16];
  Vector<long,_4> e12 [16];
  Vector<long,_4> e01 [16];
  float local_728 [4];
  undefined8 local_718;
  float fStack_710;
  float fStack_70c;
  float local_708 [4];
  TriangleRasterizer *local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  long local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  int *local_698;
  FragmentPacket *local_690;
  float *local_688;
  long local_680;
  long local_678 [4];
  long local_658 [2];
  int local_648;
  int iStack_644;
  long lStack_640;
  undefined8 local_638;
  long local_630 [60];
  long alStack_450 [64];
  long alStack_250 [68];
  
  uVar16 = (this->m_curPos).m_data[1];
  iVar21 = (this->m_bboxMax).m_data[1];
  iVar22 = 0;
  local_698 = numPacketsRasterized;
  if (0 < maxFragmentPackets && (int)uVar16 <= iVar21) {
    fVar2 = (this->m_v2).m_data[2];
    fVar40 = (this->m_v0).m_data[2] - fVar2;
    fVar41 = (this->m_v1).m_data[2] - fVar2;
    iVar22 = 0;
    local_6f8 = this;
    local_690 = fragmentPackets;
    local_688 = depthValues;
    do {
      pTVar8 = local_6f8;
      local_6e8 = (ulong)uVar16;
      uVar3 = (local_6f8->m_curPos).m_data[0];
      local_6f0 = (ulong)uVar3;
      local_678[0] = (long)(int)(uVar16 << 8);
      iVar14 = uVar16 + 1;
      local_678[2] = (long)(iVar14 * 0x100);
      iVar18 = uVar3 + 1;
      local_638._0_4_ = iVar18 * 0x100;
      local_638._4_4_ = -(uint)((int)local_638 < 0);
      local_658[0] = CONCAT44(-(uint)((int)(uVar3 << 8) < 0),uVar3 << 8);
      _local_648 = CONCAT44(local_638._4_4_,(int)local_638);
      iVar9 = (local_6f8->m_viewport).m_data[2] + (local_6f8->m_viewport).m_data[0];
      iVar15 = (local_6f8->m_viewport).m_data[3] + (local_6f8->m_viewport).m_data[1];
      plVar10 = alStack_250 + 3;
      local_678[1] = local_678[0];
      local_678[3] = local_678[2];
      memset(plVar10,0,0x200);
      plVar28 = alStack_450 + 3;
      memset(plVar28,0,0x200);
      puVar19 = &local_638;
      memset(puVar19,0,0x200);
      local_6a0 = (pTVar8->m_edge01).a;
      local_6b8 = (pTVar8->m_edge01).b;
      local_6c0 = (pTVar8->m_edge01).c;
      local_6c8 = (pTVar8->m_edge12).a;
      local_6d0 = (pTVar8->m_edge12).b;
      local_6d8 = (pTVar8->m_edge12).c;
      local_6a8 = (pTVar8->m_edge20).a;
      local_6e0 = (pTVar8->m_edge20).b;
      local_6b0 = (pTVar8->m_edge20).c;
      lVar25 = 0;
      do {
        local_680 = lVar25;
        lVar25 = (&s_samplePos16)[local_680 * 2];
        lVar27 = (&DAT_00234e78)[local_680 * 2];
        lVar20 = 0;
        do {
          lVar23 = local_658[lVar20] + lVar25;
          lVar11 = local_678[lVar20] + lVar27;
          plVar10[lVar20] = local_6b8 * lVar11 + local_6a0 * lVar23 + local_6c0;
          plVar28[lVar20] = local_6d0 * lVar11 + local_6c8 * lVar23 + local_6d8;
          puVar19[lVar20] = lVar11 * local_6e0 + lVar23 * local_6a8 + local_6b0;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 4);
        puVar19 = puVar19 + 4;
        plVar28 = plVar28 + 4;
        plVar10 = plVar10 + 4;
        lVar25 = local_680 + 1;
      } while (local_680 + 1 != 0x10);
      uVar26 = (ulong)(local_6f8->m_edge01).inclusive;
      lVar27 = -uVar26;
      uVar29 = (ulong)(local_6f8->m_edge12).inclusive;
      lVar20 = -uVar29;
      uVar24 = (ulong)(local_6f8->m_edge20).inclusive;
      lVar25 = -uVar24;
      lVar11 = 0x18;
      uVar17 = 0;
      uVar30 = 0;
      do {
        lVar23 = *(long *)((long)alStack_250 + lVar11);
        if ((lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0) ||
           (lVar23 = *(long *)((long)alStack_450 + lVar11),
           lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
          uVar31 = uVar30 & ~(1L << (uVar17 & 0x3f));
        }
        else {
          lVar23 = *(long *)((long)local_658 + lVar11 + 8);
          uVar31 = uVar30 & ~(1L << (uVar17 & 0x3f));
          if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
            uVar31 = uVar30 | 1L << (uVar17 & 0x3f);
          }
        }
        bVar13 = (byte)uVar17;
        if (((iVar18 == iVar9) ||
            (lVar23 = *(long *)((long)alStack_250 + lVar11 + 8),
            lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
           (lVar23 = *(long *)((long)alStack_450 + lVar11 + 8),
           lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
          uVar30 = uVar31 & ~(0x100000000 << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x100000000 << (bVar13 & 0x3f);
          lVar23 = *(long *)((long)&local_648 + lVar11);
          uVar30 = ~uVar12 & uVar31;
          if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
            uVar30 = uVar31 | uVar12;
          }
        }
        if (((iVar14 == iVar15) ||
            (lVar23 = *(long *)((long)alStack_250 + lVar11 + 0x10),
            lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
           (lVar23 = *(long *)((long)alStack_450 + lVar11 + 0x10),
           lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
          uVar31 = uVar30 & ~(0x10000L << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x10000L << (bVar13 & 0x3f);
          lVar23 = *(long *)((long)&lStack_640 + lVar11);
          uVar31 = ~uVar12 & uVar30;
          if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
            uVar31 = uVar30 | uVar12;
          }
        }
        if (((iVar14 == iVar15 || iVar18 == iVar9) ||
            (lVar23 = *(long *)((long)alStack_250 + lVar11 + 0x18),
            lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
           (lVar23 = *(long *)((long)alStack_450 + lVar11 + 0x18),
           lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
          uVar30 = uVar31 & ~(0x1000000000000 << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x1000000000000 << (bVar13 & 0x3f);
          lVar23 = *(long *)((long)local_630 + lVar11 + -8);
          uVar30 = ~uVar12 & uVar31;
          if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
            uVar30 = uVar31 | uVar12;
          }
        }
        uVar17 = uVar17 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar17 != 0x10);
      iVar9 = (int)local_6f0 + 2;
      (local_6f8->m_curPos).m_data[0] = iVar9;
      uVar16 = (uint)local_6e8;
      if ((local_6f8->m_bboxMax).m_data[0] < iVar9) {
        uVar16 = uVar16 + 2;
        (local_6f8->m_curPos).m_data[1] = uVar16;
        (local_6f8->m_curPos).m_data[0] = (local_6f8->m_bboxMin).m_data[0];
      }
      if (uVar30 != 0) {
        if (local_688 != (float *)0x0) {
          puVar19 = &local_638;
          plVar10 = alStack_450 + 3;
          plVar28 = alStack_250 + 3;
          lVar25 = 0;
          do {
            local_708[0] = 0.0;
            local_708[1] = 0.0;
            local_708[2] = 0.0;
            local_708[3] = 0.0;
            lVar27 = 0;
            do {
              *(ulong *)(local_708 + lVar27) =
                   CONCAT44((float)plVar28[lVar27 + 1],(float)plVar28[lVar27]);
              lVar27 = lVar27 + 2;
            } while (lVar27 != 4);
            local_718._0_4_ = 0.0;
            local_718._4_4_ = 0.0;
            fStack_710 = 0.0;
            fStack_70c = 0.0;
            lVar27 = 0;
            do {
              *(ulong *)((long)&local_718 + lVar27 * 4) =
                   CONCAT44((float)plVar10[lVar27 + 1],(float)plVar10[lVar27]);
              lVar27 = lVar27 + 2;
            } while (lVar27 != 4);
            local_728[0] = 0.0;
            local_728[1] = 0.0;
            local_728[2] = 0.0;
            local_728[3] = 0.0;
            lVar27 = 0;
            do {
              *(ulong *)(local_728 + lVar27) =
                   CONCAT44((float)(long)puVar19[lVar27 + 1],(float)(long)puVar19[lVar27]);
              lVar27 = lVar27 + 2;
            } while (lVar27 != 4);
            auVar7._4_4_ = local_718._4_4_;
            auVar7._0_4_ = (float)local_718;
            auVar7._8_4_ = fStack_710;
            auVar7._12_4_ = fStack_70c;
            auVar6._4_4_ = local_728[1];
            auVar6._0_4_ = local_728[0];
            auVar6._8_4_ = local_728[2];
            auVar6._12_4_ = local_728[3];
            local_728[0] = local_708[0] + (float)local_718 + local_728[0];
            local_728[1] = local_708[1] + local_718._4_4_ + local_728[1];
            local_728[2] = local_708[2] + fStack_710 + local_728[2];
            local_728[3] = local_708[3] + fStack_70c + local_728[3];
            auVar32._4_4_ = local_728[1];
            auVar32._0_4_ = local_728[0];
            auVar32._8_4_ = local_728[2];
            auVar32._12_4_ = local_728[3];
            auVar32 = divps(auVar7,auVar32);
            auVar34._4_4_ = local_728[1];
            auVar34._0_4_ = local_728[0];
            auVar34._8_4_ = local_728[2];
            auVar34._12_4_ = local_728[3];
            auVar34 = divps(auVar6,auVar34);
            lVar27 = lVar25 + (iVar22 << 6);
            local_688[lVar27] = auVar32._0_4_ * fVar40 + fVar41 * auVar34._0_4_ + fVar2;
            local_688[lVar27 + 0x10] = auVar32._4_4_ * fVar40 + auVar34._4_4_ * fVar41 + fVar2;
            local_688[lVar27 + 0x20] = auVar32._8_4_ * fVar40 + auVar34._8_4_ * fVar41 + fVar2;
            local_688[lVar27 + 0x30] = auVar32._12_4_ * fVar40 + auVar34._12_4_ * fVar41 + fVar2;
            lVar25 = lVar25 + 1;
            plVar28 = plVar28 + 4;
            plVar10 = plVar10 + 4;
            puVar19 = puVar19 + 4;
          } while (lVar25 != 0x10);
        }
        local_708[0] = 0.0;
        local_708[1] = 0.0;
        local_708[2] = 0.0;
        local_708[3] = 0.0;
        local_718._0_4_ = 0.0;
        local_718._4_4_ = 0.0;
        fStack_710 = 0.0;
        fStack_70c = 0.0;
        local_728[0] = 0.0;
        local_728[1] = 0.0;
        local_728[2] = 0.0;
        local_728[3] = 0.0;
        lVar25 = 0;
        do {
          lVar27 = *(long *)((long)local_658 + lVar25 * 2) + 0x80;
          lVar20 = *(long *)((long)local_678 + lVar25 * 2) + 0x80;
          *(float *)((long)local_708 + lVar25) =
               (float)(local_6b8 * lVar20 + local_6a0 * lVar27 + local_6c0);
          *(float *)((long)&local_718 + lVar25) =
               (float)(local_6d0 * lVar20 + local_6c8 * lVar27 + local_6d8);
          *(float *)((long)local_728 + lVar25) =
               (float)(lVar20 * local_6e0 + lVar27 * local_6a8 + local_6b0);
          lVar25 = lVar25 + 4;
        } while (lVar25 != 0x10);
        fVar39 = (local_6f8->m_v0).m_data[3];
        auVar33._0_4_ = fVar39 * (float)local_718;
        auVar33._4_4_ = fVar39 * local_718._4_4_;
        auVar33._8_4_ = fVar39 * fStack_710;
        auVar33._12_4_ = fVar39 * fStack_70c;
        fVar39 = (local_6f8->m_v1).m_data[3];
        auVar35._0_4_ = fVar39 * local_728[0];
        auVar35._4_4_ = fVar39 * local_728[1];
        auVar35._8_4_ = fVar39 * local_728[2];
        auVar35._12_4_ = fVar39 * local_728[3];
        fVar39 = (local_6f8->m_v2).m_data[3];
        fVar36 = auVar33._0_4_ + auVar35._0_4_ + fVar39 * local_708[0];
        fVar37 = auVar33._4_4_ + auVar35._4_4_ + fVar39 * local_708[1];
        fVar38 = auVar33._8_4_ + auVar35._8_4_ + fVar39 * local_708[2];
        fVar39 = auVar33._12_4_ + auVar35._12_4_ + fVar39 * local_708[3];
        *(ulong *)local_690[iVar22].position.m_data = (local_6e8 << 0x20) + local_6f0;
        local_690[iVar22].coverage = uVar30;
        auVar4._4_4_ = fVar37;
        auVar4._0_4_ = fVar36;
        auVar4._8_4_ = fVar38;
        auVar4._12_4_ = fVar39;
        auVar32 = divps(auVar33,auVar4);
        *(undefined1 (*) [16])local_690[iVar22].barycentric[0].m_data = auVar32;
        auVar5._4_4_ = fVar37;
        auVar5._0_4_ = fVar36;
        auVar5._8_4_ = fVar38;
        auVar5._12_4_ = fVar39;
        auVar34 = divps(auVar35,auVar5);
        *(undefined1 (*) [16])local_690[iVar22].barycentric[1].m_data = auVar34;
        pVVar1 = local_690[iVar22].barycentric + 2;
        pVVar1->m_data[0] = (1.0 - auVar32._0_4_) - auVar34._0_4_;
        pVVar1->m_data[1] = (1.0 - auVar32._4_4_) - auVar34._4_4_;
        pVVar1->m_data[2] = (1.0 - auVar32._8_4_) - auVar34._8_4_;
        pVVar1->m_data[3] = (1.0 - auVar32._12_4_) - auVar34._12_4_;
        iVar22 = iVar22 + 1;
        iVar21 = (local_6f8->m_bboxMax).m_data[1];
        uVar16 = (local_6f8->m_curPos).m_data[1];
      }
    } while (((int)uVar16 <= iVar21) && (iVar22 < maxFragmentPackets));
  }
  *local_698 = iVar22;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}